

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  uchar uVar1;
  int iVar2;
  char *key;
  char *langtag;
  char *transkey;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t __n;
  size_t size_00;
  uchar *str;
  size_t size;
  uchar *local_48;
  LodePNGDecompressSettings *local_40;
  size_t local_38;
  
  if (chunkLength < 5) {
    uVar5 = 0x1e;
  }
  else {
    uVar5 = 1;
    __n = 0;
    do {
      if (data[__n] == '\0') break;
      __n = (size_t)uVar5;
      uVar5 = uVar5 + 1;
    } while (__n < chunkLength);
    uVar6 = uVar5 - 1;
    uVar4 = (ulong)(uVar5 + 2);
    if (uVar4 < chunkLength) {
      if (0xffffffb0 < uVar5 - 0x51) {
        local_40 = zlibsettings;
        key = (char *)malloc((ulong)uVar6 + 1);
        if (key == (char *)0x0) {
          key = (char *)0x0;
          langtag = (char *)0x0;
        }
        else {
          if (uVar6 != 0) {
            memcpy(key,data,__n);
          }
          key[__n] = '\0';
          transkey = (char *)0x0;
          if (data[__n + 2] != '\0') {
            uVar5 = 0x48;
            langtag = (char *)0x0;
            goto LAB_001201c3;
          }
          if (uVar4 < chunkLength) {
            transkey = (char *)0x0;
            uVar3 = uVar4;
            do {
              if (data[uVar3] == '\0') break;
              uVar3 = (ulong)(uVar5 + 3 + (int)transkey);
              transkey = (char *)(ulong)((int)transkey + 1);
            } while (uVar3 < chunkLength);
          }
          uVar1 = data[(ulong)uVar6 + 1];
          iVar2 = (int)transkey;
          langtag = (char *)malloc((ulong)(iVar2 + 1U));
          if (langtag == (char *)0x0) {
            langtag = (char *)0x0;
          }
          else {
            if (iVar2 != 0) {
              memcpy(langtag,data + uVar4,(size_t)transkey);
            }
            langtag[(long)transkey] = '\0';
            uVar5 = iVar2 + 1U + uVar5 + 2;
            uVar4 = (ulong)uVar5;
            uVar7 = 0;
            if (uVar4 < chunkLength) {
              uVar7 = 0;
              uVar3 = uVar4;
              do {
                if (data[uVar3] == '\0') break;
                uVar3 = (ulong)(uVar6 + iVar2 + 5 + uVar7);
                uVar7 = uVar7 + 1;
              } while (uVar3 < chunkLength);
            }
            transkey = (char *)malloc((ulong)(uVar7 + 1));
            if (transkey != (char *)0x0) {
              if (uVar7 != 0) {
                memcpy(transkey,data + uVar4,(ulong)uVar7);
              }
              transkey[uVar7] = '\0';
              uVar5 = uVar7 + 1 + uVar5;
              size_00 = (size_t)((uint)chunkLength - uVar5);
              if ((uint)chunkLength < uVar5) {
                size_00 = 0;
              }
              if (uVar1 == '\0') {
                uVar5 = lodepng_add_itext_sized
                                  (info,key,langtag,transkey,(char *)(data + uVar5),size_00);
              }
              else {
                local_48 = (uchar *)0x0;
                local_38 = 0;
                uVar5 = zlib_decompress(&local_48,&local_38,0,data + uVar5,size_00,local_40);
                if (uVar5 == 0) {
                  uVar5 = lodepng_add_itext_sized
                                    (info,key,langtag,transkey,(char *)local_48,local_38);
                }
                free(local_48);
              }
              goto LAB_001201c3;
            }
          }
        }
        transkey = (char *)0x0;
        uVar5 = 0x53;
        goto LAB_001201c3;
      }
      uVar5 = 0x59;
    }
    else {
      uVar5 = 0x4b;
    }
  }
  key = (char *)0x0;
  langtag = (char *)0x0;
  transkey = (char *)0x0;
LAB_001201c3:
  free(key);
  free(langtag);
  free(transkey);
  return uVar5;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(langtag, data + begin, length);
    langtag[length] = 0;

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(transkey, data + begin, length);
    transkey[length] = 0;

    /*read the actual text*/
    begin += length + 1;

    length = (unsigned)chunkLength < begin ? 0 : (unsigned)chunkLength - begin;

    if(compressed) {
      unsigned char* str = 0;
      size_t size = 0;
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&str, &size, 0, &data[begin],
                              length, zlibsettings);
      if(!error) error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)str, size);
      lodepng_free(str);
    } else {
      error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)(data + begin), length);
    }

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);

  return error;
}